

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O1

void __thiscall libtorrent::dht::traversal_algorithm::add_router_entries(traversal_algorithm *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  node *pnVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  uint uVar6;
  node_id local_48;
  
  pdVar2 = this->m_node->m_observer;
  if ((pdVar2 != (dht_observer *)0x0) &&
     (iVar4 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar4 != '\0')) {
    uVar1 = this->m_id;
    pnVar3 = this->m_node;
    p_Var5 = (pnVar3->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar6 = 0;
    while ((_Rb_tree_header *)p_Var5 !=
           &(pnVar3->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header) {
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
      uVar6 = uVar6 + 1;
    }
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
              (pdVar2,4,"[%u] using router nodes to initiate traversal algorithm %d routers",
               (ulong)uVar1,(ulong)uVar6);
  }
  pnVar3 = this->m_node;
  for (p_Var5 = (pnVar3->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(pnVar3->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
    local_48.m_number._M_elems[0] = 0;
    local_48.m_number._M_elems[1] = 0;
    local_48.m_number._M_elems[2] = 0;
    local_48.m_number._M_elems[3] = 0;
    local_48.m_number._M_elems[4] = 0;
    add_entry(this,&local_48,(endpoint *)(p_Var5 + 1),(observer_flags_t)0x2);
  }
  return;
}

Assistant:

void traversal_algorithm::add_router_entries()
{
	INVARIANT_CHECK;
#ifndef TORRENT_DISABLE_LOGGING
	dht_observer* logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] using router nodes to initiate traversal algorithm %d routers"
			, m_id, int(std::distance(m_node.m_table.begin(), m_node.m_table.end())));
	}
#endif
	for (auto const& n : m_node.m_table)
		add_entry(node_id(), n, observer::flag_initial);
}